

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::LeaveMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  AddressType AVar1;
  uint32_t local_44;
  uint32_t local_40;
  ip_mreq mreq_1;
  ip_mreq mreq;
  uint32_t mcastIP;
  RTPIPv4Address *address;
  int status;
  RTPAddress *addr_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv4Address) {
      unique0x1000012b = addr;
      mreq.imr_multiaddr.s_addr = RTPIPv4Address::GetIP((RTPIPv4Address *)addr);
      if ((mreq.imr_multiaddr.s_addr & 0xf0000000) == 0xe0000000) {
        address._4_4_ =
             RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
             DeleteElement(&this->multicastgroups,(uint *)&mreq);
        if (-1 < address._4_4_) {
          mreq_1.imr_multiaddr.s_addr = htonl(mreq.imr_multiaddr.s_addr);
          mreq_1.imr_interface.s_addr = htonl(this->mcastifaceIP);
          setsockopt(this->rtpsock,0,0x24,&mreq_1,8);
          if (this->rtpsock != this->rtcpsock) {
            local_44 = htonl(mreq.imr_multiaddr.s_addr);
            local_40 = htonl(this->mcastifaceIP);
            setsockopt(this->rtcpsock,0,0x24,&local_44,8);
          }
          address._4_4_ = 0;
        }
        this_local._4_4_ = address._4_4_;
      }
      else {
        this_local._4_4_ = -0x58;
      }
    }
    else {
      this_local._4_4_ = -0x54;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::LeaveMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.DeleteElement(mcastIP);
	if (status >= 0)
	{	
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
		if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);

		status = 0;
	}
	
	MAINMUTEX_UNLOCK
	return status;
}